

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O1

U32 ZSTD_insertBt1(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,U32 mls,int extDict)

{
  ulong *puVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  char cVar8;
  uint uVar9;
  uint *puVar10;
  uint uVar11;
  uint uVar12;
  ulong *puVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  BYTE *pBVar17;
  ulong *puVar18;
  U32 *pUVar19;
  bool bVar20;
  U32 dummy32;
  BYTE *pInLoopLimit;
  int local_cc;
  uint *local_c0;
  uint *local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  uint local_94;
  ulong local_90;
  BYTE *local_88;
  ulong *local_80;
  ulong local_78;
  BYTE *local_70;
  BYTE *local_68;
  BYTE *local_60;
  U32 *local_58;
  ulong *local_50;
  ulong *local_48;
  BYTE *local_40;
  ulong local_38;
  
  cVar8 = (char)(ms->cParams).hashLog;
  switch(mls) {
  case 5:
    lVar4 = -0x30e4432345000000;
    break;
  case 6:
    lVar4 = -0x30e4432340650000;
    break;
  case 7:
    lVar4 = -0x30e44323405a9d00;
    break;
  case 8:
    lVar4 = -0x30e44323485a9b9d;
    break;
  default:
    uVar6 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar8 & 0x1fU));
    goto LAB_00232312;
  }
  uVar6 = (ulong)(lVar4 * *(long *)ip) >> (-cVar8 & 0x3fU);
LAB_00232312:
  pUVar19 = ms->chainTable;
  uVar11 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  local_38 = (ulong)ms->hashTable[uVar6];
  local_88 = (ms->window).base;
  local_60 = (ms->window).dictBase;
  local_90 = (ulong)(ms->window).dictLimit;
  local_68 = local_60 + local_90;
  local_70 = local_88 + local_90;
  uVar12 = (int)ip - (int)local_88;
  local_78 = (ulong)uVar12;
  uVar9 = uVar12 - uVar11;
  local_a0 = 0;
  if (uVar12 < uVar11) {
    uVar9 = 0;
  }
  uVar2 = (ms->window).lowLimit;
  uVar3 = (ms->cParams).searchLog;
  ms->hashTable[uVar6] = uVar12;
  uVar6 = (ulong)((uVar12 & uVar11) * 2);
  local_b8 = pUVar19 + uVar6;
  iVar14 = 1 << ((byte)uVar3 & 0x1f);
  local_c0 = pUVar19 + uVar6 + 1;
  local_cc = uVar12 + 9;
  local_80 = (ulong *)(iend + -7);
  local_48 = (ulong *)(iend + -3);
  local_50 = (ulong *)(iend + -1);
  local_b0 = 8;
  local_a8 = 0;
  local_58 = pUVar19;
  do {
    bVar20 = iVar14 == 0;
    iVar14 = iVar14 + -1;
    if ((bVar20) || ((uint)local_38 < uVar2)) break;
    uVar6 = local_a0;
    if (local_a8 < local_a0) {
      uVar6 = local_a8;
    }
    uVar16 = local_38 & 0xffffffff;
    if ((extDict == 0) || (local_90 <= uVar16 + uVar6)) {
      puVar1 = (ulong *)(ip + uVar6);
      puVar18 = (ulong *)(local_88 + uVar16 + uVar6);
      puVar13 = puVar1;
      if (puVar1 < local_80) {
        uVar7 = *puVar1 ^ *puVar18;
        uVar15 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
          }
        }
        uVar15 = uVar15 >> 3 & 0x1fffffff;
        if (*puVar18 == *puVar1) {
          do {
            puVar13 = puVar13 + 1;
            puVar18 = puVar18 + 1;
            if (local_80 <= puVar13) goto LAB_00232514;
            uVar7 = *puVar13 ^ *puVar18;
            uVar15 = 0;
            if (uVar7 != 0) {
              for (; (uVar7 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            uVar15 = (long)puVar13 + ((uVar15 >> 3 & 0x1fffffff) - (long)puVar1);
          } while (*puVar18 == *puVar13);
        }
      }
      else {
LAB_00232514:
        if ((puVar13 < local_48) && ((int)*puVar18 == (int)*puVar13)) {
          puVar13 = (ulong *)((long)puVar13 + 4);
          puVar18 = (ulong *)((long)puVar18 + 4);
        }
        if ((puVar13 < local_50) && ((short)*puVar18 == (short)*puVar13)) {
          puVar13 = (ulong *)((long)puVar13 + 2);
          puVar18 = (ulong *)((long)puVar18 + 2);
        }
        if (puVar13 < iend) {
          puVar13 = (ulong *)((long)puVar13 + (ulong)((char)*puVar18 == (char)*puVar13));
        }
        uVar15 = (long)puVar13 - (long)puVar1;
      }
      uVar6 = uVar15 + uVar6;
      pBVar17 = local_88 + uVar16;
    }
    else {
      local_40 = local_60 + uVar16;
      sVar5 = ZSTD_count_2segments(ip + uVar6,local_40 + uVar6,iend,local_68,local_70);
      uVar6 = sVar5 + uVar6;
      pBVar17 = local_88 + uVar16;
      pUVar19 = local_58;
      if (uVar6 + uVar16 < local_90) {
        pBVar17 = local_40;
      }
    }
    uVar12 = (uint)local_38;
    if ((local_b0 < uVar6) && (local_b0 = uVar6, local_cc - uVar12 < uVar6)) {
      local_cc = uVar12 + (int)uVar6;
    }
    if (ip + uVar6 == iend) {
      bVar20 = false;
    }
    else {
      puVar10 = pUVar19 + (uVar12 & uVar11) * 2;
      if (pBVar17[uVar6] < ip[uVar6]) {
        *local_b8 = uVar12;
        local_a8 = uVar6;
        if (uVar9 < uVar12) {
          puVar10 = puVar10 + 1;
          local_b8 = puVar10;
LAB_002325f6:
          local_38 = (ulong)*puVar10;
          bVar20 = true;
        }
        else {
          bVar20 = false;
          local_b8 = &local_94;
        }
      }
      else {
        *local_c0 = uVar12;
        local_c0 = puVar10;
        local_a0 = uVar6;
        if (uVar9 < uVar12) goto LAB_002325f6;
        bVar20 = false;
        local_c0 = &local_94;
      }
    }
  } while (bVar20);
  uVar11 = (int)local_b0 - 0x180;
  uVar9 = 0xc0;
  if (uVar11 < 0xc0) {
    uVar9 = uVar11;
  }
  *local_c0 = 0;
  if (local_b0 < 0x181) {
    uVar9 = 0;
  }
  *local_b8 = 0;
  uVar11 = (local_cc - (int)local_78) - 8;
  if (uVar11 < uVar9) {
    uVar11 = uVar9;
  }
  return uVar11;
}

Assistant:

static U32 ZSTD_insertBt1(
                ZSTD_matchState_t* ms,
                const BYTE* const ip, const BYTE* const iend,
                U32 const mls, const int extDict)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32 matchIndex = hashTable[h];
    size_t commonLengthSmaller=0, commonLengthLarger=0;
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const U32 dictLimit = ms->window.dictLimit;
    const BYTE* const dictEnd = dictBase + dictLimit;
    const BYTE* const prefixStart = base + dictLimit;
    const BYTE* match;
    const U32 curr = (U32)(ip-base);
    const U32 btLow = btMask >= curr ? 0 : curr - btMask;
    U32* smallerPtr = bt + 2*(curr&btMask);
    U32* largerPtr  = smallerPtr + 1;
    U32 dummy32;   /* to be nullified at the end */
    U32 const windowLow = ms->window.lowLimit;
    U32 matchEndIdx = curr+8+1;
    size_t bestLength = 8;
    U32 nbCompares = 1U << cParams->searchLog;
#ifdef ZSTD_C_PREDICT
    U32 predictedSmall = *(bt + 2*((curr-1)&btMask) + 0);
    U32 predictedLarge = *(bt + 2*((curr-1)&btMask) + 1);
    predictedSmall += (predictedSmall>0);
    predictedLarge += (predictedLarge>0);
#endif /* ZSTD_C_PREDICT */

    DEBUGLOG(8, "ZSTD_insertBt1 (%u)", curr);

    assert(ip <= iend-8);   /* required for h calculation */
    hashTable[h] = curr;   /* Update Hash Table */

    assert(windowLow > 0);
    while (nbCompares-- && (matchIndex >= windowLow)) {
        U32* const nextPtr = bt + 2*(matchIndex & btMask);
        size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
        assert(matchIndex < curr);

#ifdef ZSTD_C_PREDICT   /* note : can create issues when hlog small <= 11 */
        const U32* predictPtr = bt + 2*((matchIndex-1) & btMask);   /* written this way, as bt is a roll buffer */
        if (matchIndex == predictedSmall) {
            /* no need to check length, result known */
            *smallerPtr = matchIndex;
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
            matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            predictedSmall = predictPtr[1] + (predictPtr[1]>0);
            continue;
        }
        if (matchIndex == predictedLarge) {
            *largerPtr = matchIndex;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
            predictedLarge = predictPtr[0] + (predictPtr[0]>0);
            continue;
        }
#endif

        if (!extDict || (matchIndex+matchLength >= dictLimit)) {
            assert(matchIndex+matchLength >= dictLimit);   /* might be wrong if actually extDict */
            match = base + matchIndex;
            matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
        } else {
            match = dictBase + matchIndex;
            matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
            if (matchIndex+matchLength >= dictLimit)
                match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
        }

        if (matchLength > bestLength) {
            bestLength = matchLength;
            if (matchLength > matchEndIdx - matchIndex)
                matchEndIdx = matchIndex + (U32)matchLength;
        }

        if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
            break;   /* drop , to guarantee consistency ; miss a bit of compression, but other solutions can corrupt tree */
        }

        if (match[matchLength] < ip[matchLength]) {  /* necessarily within buffer */
            /* match is smaller than current */
            *smallerPtr = matchIndex;             /* update smaller idx */
            commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            smallerPtr = nextPtr+1;               /* new "candidate" => larger than match, which was smaller than target */
            matchIndex = nextPtr[1];              /* new matchIndex, larger than previous and closer to current */
        } else {
            /* match is larger than current */
            *largerPtr = matchIndex;
            commonLengthLarger = matchLength;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
    }   }

    *smallerPtr = *largerPtr = 0;
    {   U32 positions = 0;
        if (bestLength > 384) positions = MIN(192, (U32)(bestLength - 384));   /* speed optimization */
        assert(matchEndIdx > curr + 8);
        return MAX(positions, matchEndIdx - (curr + 8));
    }
}